

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O3

void mpr_print_sets(nhdp_domain *domain,neighbor_graph *graph)

{
  if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
    oonf_log(1,(ulong)LOG_MPR,"src/nhdp/mpr/neighbor-graph.c",0xfd,0,0,"Set N");
  }
  mpr_print_addr_set(&graph->set_n);
  if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
    oonf_log(1,(ulong)LOG_MPR,"src/nhdp/mpr/neighbor-graph.c",0x100,0,0,"Set N1");
  }
  mpr_print_n1_set(domain,&graph->set_n1);
  if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
    oonf_log(1,(ulong)LOG_MPR,"src/nhdp/mpr/neighbor-graph.c",0x103,0,0,"Set N2");
  }
  mpr_print_addr_set(&graph->set_n2);
  if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
    oonf_log(1,(ulong)LOG_MPR,"src/nhdp/mpr/neighbor-graph.c",0x106,0,0,"Set MPR");
  }
  mpr_print_n1_set(domain,&graph->set_mpr);
  return;
}

Assistant:

void
mpr_print_sets(struct nhdp_domain *domain, struct neighbor_graph *graph) {
  OONF_DEBUG(LOG_MPR, "Set N");
  mpr_print_addr_set(&graph->set_n);

  OONF_DEBUG(LOG_MPR, "Set N1");
  mpr_print_n1_set(domain, &graph->set_n1);

  OONF_DEBUG(LOG_MPR, "Set N2");
  mpr_print_addr_set(&graph->set_n2);

  OONF_DEBUG(LOG_MPR, "Set MPR");
  mpr_print_n1_set(domain, &graph->set_mpr);
}